

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

Fraction operator*(Fraction *a,Fraction *b)

{
  Fraction *b_local;
  Fraction *a_local;
  Fraction current_frac;
  
  a_local._0_4_ = (*a).numerator_;
  a_local._4_4_ = (*a).denominator_;
  a_local = (Fraction *)CONCAT44(b->denominator_ * a_local._4_4_,b->numerator_ * (int)a_local);
  Fraction::Normalization((Fraction *)&a_local);
  return (Fraction)a_local;
}

Assistant:

Fraction operator*(const Fraction& a, const Fraction& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b.numerator_;
  current_frac.denominator_ *= b.denominator_;
  current_frac.Normalization();
  return current_frac;
}